

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastIntrinsics.h
# Opt level: O3

void NFastOps::ExpAvx2<false,true>(float *from,size_t size,float *to)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  float fVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  ulong uVar7;
  ulong uVar8;
  undefined1 (*pauVar9) [32];
  float *pfVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar22 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar24 [36];
  undefined1 auVar23 [64];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar44 [36];
  undefined1 auVar43 [64];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 in_ZMM7 [64];
  undefined1 auVar55 [36];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 in_ZMM9 [64];
  undefined1 auVar61 [64];
  
  auVar44 = in_ZMM4._28_36_;
  auVar55 = in_ZMM7._28_36_;
  auVar24 = in_ZMM1._28_36_;
  uVar7 = size * 4 & 0xffffffffffffff80;
  if (uVar7 != 0) {
    uVar8 = 0;
    auVar42._8_4_ = 0x43000000;
    auVar42._0_8_ = 0x4300000043000000;
    auVar42._12_4_ = 0x43000000;
    auVar42._16_4_ = 0x43000000;
    auVar42._20_4_ = 0x43000000;
    auVar42._24_4_ = 0x43000000;
    auVar42._28_4_ = 0x43000000;
    auVar24 = ZEXT436(0x43000000);
    auVar27._8_4_ = 0xc2fe0000;
    auVar27._0_8_ = 0xc2fe0000c2fe0000;
    auVar27._12_4_ = 0xc2fe0000;
    auVar27._16_4_ = 0xc2fe0000;
    auVar27._20_4_ = 0xc2fe0000;
    auVar27._24_4_ = 0xc2fe0000;
    auVar27._28_4_ = 0xc2fe0000;
    auVar36._8_4_ = 0xbe9d2ae5;
    auVar36._0_8_ = 0xbe9d2ae5be9d2ae5;
    auVar36._12_4_ = 0xbe9d2ae5;
    auVar36._16_4_ = 0xbe9d2ae5;
    auVar36._20_4_ = 0xbe9d2ae5;
    auVar36._24_4_ = 0xbe9d2ae5;
    auVar36._28_4_ = 0xbe9d2ae5;
    auVar41._8_4_ = 0xbd865310;
    auVar41._0_8_ = 0xbd865310bd865310;
    auVar41._12_4_ = 0xbd865310;
    auVar41._16_4_ = 0xbd865310;
    auVar41._20_4_ = 0xbd865310;
    auVar41._24_4_ = 0xbd865310;
    auVar41._28_4_ = 0xbd865310;
    auVar44 = ZEXT436(0xbd865310);
    auVar45._8_4_ = 0xbc5e18ed;
    auVar45._0_8_ = 0xbc5e18edbc5e18ed;
    auVar45._12_4_ = 0xbc5e18ed;
    auVar45._16_4_ = 0xbc5e18ed;
    auVar45._20_4_ = 0xbc5e18ed;
    auVar45._24_4_ = 0xbc5e18ed;
    auVar45._28_4_ = 0xbc5e18ed;
    do {
      pfVar10 = (float *)((long)from + uVar8);
      auVar53._0_4_ = *pfVar10 * 1.442695;
      auVar53._4_4_ = pfVar10[1] * 1.442695;
      auVar53._8_4_ = pfVar10[2] * 1.442695;
      auVar53._12_4_ = pfVar10[3] * 1.442695;
      auVar53._16_4_ = pfVar10[4] * 1.442695;
      auVar53._20_4_ = pfVar10[5] * 1.442695;
      auVar53._28_36_ = in_ZMM7._28_36_;
      auVar53._24_4_ = pfVar10[6] * 1.442695;
      auVar56 = vminps_avx(auVar53._0_32_,auVar42);
      auVar56 = vmaxps_avx(auVar56,auVar27);
      auVar1 = vroundps_avx(auVar56,1);
      auVar2 = vsubps_avx(auVar56,auVar1);
      auVar56 = vcvtps2dq_avx(auVar1);
      auVar61._0_4_ = auVar2._0_4_ * auVar2._0_4_;
      auVar61._4_4_ = auVar2._4_4_ * auVar2._4_4_;
      auVar61._8_4_ = auVar2._8_4_ * auVar2._8_4_;
      auVar61._12_4_ = auVar2._12_4_ * auVar2._12_4_;
      auVar61._16_4_ = auVar2._16_4_ * auVar2._16_4_;
      auVar61._20_4_ = auVar2._20_4_ * auVar2._20_4_;
      auVar61._28_36_ = in_ZMM9._28_36_;
      auVar61._24_4_ = auVar2._24_4_ * auVar2._24_4_;
      auVar19 = vfmadd213ps_fma(auVar41,auVar2,auVar36);
      auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar61._0_32_,auVar45);
      auVar1 = vsubps_avx(auVar2,auVar61._0_32_);
      auVar19 = vfmadd213ps_fma(auVar1,ZEXT1632(auVar19),auVar2);
      auVar48._0_4_ = auVar19._0_4_ + 1.0;
      auVar48._4_4_ = auVar19._4_4_ + 1.0;
      auVar48._8_4_ = auVar19._8_4_ + 1.0;
      auVar48._12_4_ = auVar19._12_4_ + 1.0;
      auVar48._16_4_ = 0x3f800000;
      auVar48._20_4_ = 0x3f800000;
      auVar48._24_4_ = 0x3f800000;
      auVar48._28_4_ = 0x3f800000;
      auVar56 = vpslld_avx2(auVar56,0x17);
      auVar56 = vpaddd_avx2(auVar56,auVar48);
      *(undefined1 (*) [32])((long)to + uVar8) = auVar56;
      pfVar10 = (float *)((long)from + uVar8 + 0x20);
      auVar1._4_4_ = pfVar10[1] * 1.442695;
      auVar1._0_4_ = *pfVar10 * 1.442695;
      auVar1._8_4_ = pfVar10[2] * 1.442695;
      auVar1._12_4_ = pfVar10[3] * 1.442695;
      auVar1._16_4_ = pfVar10[4] * 1.442695;
      auVar1._20_4_ = pfVar10[5] * 1.442695;
      auVar1._24_4_ = pfVar10[6] * 1.442695;
      auVar1._28_4_ = auVar56._28_4_;
      auVar56 = vminps_avx(auVar1,auVar42);
      auVar56 = vmaxps_avx(auVar56,auVar27);
      auVar1 = vroundps_avx(auVar56,1);
      auVar2 = vsubps_avx(auVar56,auVar1);
      auVar56 = vcvtps2dq_avx(auVar1);
      auVar57._0_4_ = auVar2._0_4_ * auVar2._0_4_;
      auVar57._4_4_ = auVar2._4_4_ * auVar2._4_4_;
      auVar57._8_4_ = auVar2._8_4_ * auVar2._8_4_;
      auVar57._12_4_ = auVar2._12_4_ * auVar2._12_4_;
      auVar57._16_4_ = auVar2._16_4_ * auVar2._16_4_;
      auVar57._20_4_ = auVar2._20_4_ * auVar2._20_4_;
      auVar57._24_4_ = auVar2._24_4_ * auVar2._24_4_;
      auVar57._28_4_ = 0;
      auVar19 = vfmadd213ps_fma(auVar41,auVar2,auVar36);
      auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar57,auVar45);
      auVar1 = vsubps_avx(auVar2,auVar57);
      auVar19 = vfmadd213ps_fma(auVar1,ZEXT1632(auVar19),auVar2);
      auVar49._0_4_ = auVar19._0_4_ + 1.0;
      auVar49._4_4_ = auVar19._4_4_ + 1.0;
      auVar49._8_4_ = auVar19._8_4_ + 1.0;
      auVar49._12_4_ = auVar19._12_4_ + 1.0;
      auVar49._16_4_ = 0x3f800000;
      auVar49._20_4_ = 0x3f800000;
      auVar49._24_4_ = 0x3f800000;
      auVar49._28_4_ = 0x3f800000;
      auVar56 = vpslld_avx2(auVar56,0x17);
      auVar56 = vpaddd_avx2(auVar56,auVar49);
      *(undefined1 (*) [32])((long)to + uVar8 + 0x20) = auVar56;
      pfVar10 = (float *)((long)from + uVar8 + 0x40);
      auVar2._4_4_ = pfVar10[1] * 1.442695;
      auVar2._0_4_ = *pfVar10 * 1.442695;
      auVar2._8_4_ = pfVar10[2] * 1.442695;
      auVar2._12_4_ = pfVar10[3] * 1.442695;
      auVar2._16_4_ = pfVar10[4] * 1.442695;
      auVar2._20_4_ = pfVar10[5] * 1.442695;
      auVar2._24_4_ = pfVar10[6] * 1.442695;
      auVar2._28_4_ = auVar56._28_4_;
      auVar56 = vminps_avx(auVar2,auVar42);
      auVar56 = vmaxps_avx(auVar56,auVar27);
      auVar1 = vroundps_avx(auVar56,1);
      auVar2 = vsubps_avx(auVar56,auVar1);
      auVar56 = vcvtps2dq_avx(auVar1);
      auVar58._0_4_ = auVar2._0_4_ * auVar2._0_4_;
      auVar58._4_4_ = auVar2._4_4_ * auVar2._4_4_;
      auVar58._8_4_ = auVar2._8_4_ * auVar2._8_4_;
      auVar58._12_4_ = auVar2._12_4_ * auVar2._12_4_;
      auVar58._16_4_ = auVar2._16_4_ * auVar2._16_4_;
      auVar58._20_4_ = auVar2._20_4_ * auVar2._20_4_;
      auVar58._24_4_ = auVar2._24_4_ * auVar2._24_4_;
      auVar58._28_4_ = 0;
      auVar19 = vfmadd213ps_fma(auVar41,auVar2,auVar36);
      auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar58,auVar45);
      auVar1 = vsubps_avx(auVar2,auVar58);
      auVar19 = vfmadd213ps_fma(auVar1,ZEXT1632(auVar19),auVar2);
      auVar50._0_4_ = auVar19._0_4_ + 1.0;
      auVar50._4_4_ = auVar19._4_4_ + 1.0;
      auVar50._8_4_ = auVar19._8_4_ + 1.0;
      auVar50._12_4_ = auVar19._12_4_ + 1.0;
      auVar50._16_4_ = 0x3f800000;
      auVar50._20_4_ = 0x3f800000;
      auVar50._24_4_ = 0x3f800000;
      auVar50._28_4_ = 0x3f800000;
      auVar56 = vpslld_avx2(auVar56,0x17);
      auVar56 = vpaddd_avx2(auVar56,auVar50);
      *(undefined1 (*) [32])((long)to + uVar8 + 0x40) = auVar56;
      pfVar10 = (float *)((long)from + uVar8 + 0x60);
      auVar4._4_4_ = pfVar10[1] * 1.442695;
      auVar4._0_4_ = *pfVar10 * 1.442695;
      auVar4._8_4_ = pfVar10[2] * 1.442695;
      auVar4._12_4_ = pfVar10[3] * 1.442695;
      auVar4._16_4_ = pfVar10[4] * 1.442695;
      auVar4._20_4_ = pfVar10[5] * 1.442695;
      auVar4._24_4_ = pfVar10[6] * 1.442695;
      auVar4._28_4_ = auVar56._28_4_;
      auVar56 = vminps_avx(auVar4,auVar42);
      auVar56 = vmaxps_avx(auVar56,auVar27);
      auVar1 = vroundps_avx(auVar56,1);
      auVar2 = vsubps_avx(auVar56,auVar1);
      auVar56 = vcvtps2dq_avx(auVar1);
      auVar59._0_4_ = auVar2._0_4_ * auVar2._0_4_;
      auVar59._4_4_ = auVar2._4_4_ * auVar2._4_4_;
      auVar59._8_4_ = auVar2._8_4_ * auVar2._8_4_;
      auVar59._12_4_ = auVar2._12_4_ * auVar2._12_4_;
      auVar59._16_4_ = auVar2._16_4_ * auVar2._16_4_;
      auVar59._20_4_ = auVar2._20_4_ * auVar2._20_4_;
      auVar59._24_4_ = auVar2._24_4_ * auVar2._24_4_;
      auVar59._28_4_ = 0;
      auVar19 = vfmadd213ps_fma(auVar41,auVar2,auVar36);
      auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar59,auVar45);
      auVar1 = vsubps_avx(auVar2,auVar59);
      auVar19 = vfmadd213ps_fma(auVar1,ZEXT1632(auVar19),auVar2);
      in_ZMM9 = ZEXT1664(auVar19);
      auVar51._0_4_ = auVar19._0_4_ + 1.0;
      auVar51._4_4_ = auVar19._4_4_ + 1.0;
      auVar51._8_4_ = auVar19._8_4_ + 1.0;
      auVar51._12_4_ = auVar19._12_4_ + 1.0;
      auVar51._16_4_ = 0x3f800000;
      auVar51._20_4_ = 0x3f800000;
      auVar51._24_4_ = 0x3f800000;
      auVar51._28_4_ = 0x3f800000;
      auVar56 = vpslld_avx2(auVar56,0x17);
      auVar56 = vpaddd_avx2(auVar56,auVar51);
      in_ZMM7 = ZEXT3264(auVar56);
      auVar55 = ZEXT436(auVar56._28_4_);
      *(undefined1 (*) [32])((long)to + uVar8 + 0x60) = auVar56;
      uVar8 = uVar8 + 0x80;
    } while (uVar8 < uVar7);
  }
  pfVar10 = (float *)((long)from + uVar7);
  pauVar9 = (undefined1 (*) [32])((long)to + uVar7);
  if ((size & 0x10) != 0) {
    auVar23._0_4_ = *pfVar10 * 1.442695;
    auVar23._4_4_ = pfVar10[1] * 1.442695;
    auVar23._8_4_ = pfVar10[2] * 1.442695;
    auVar23._12_4_ = pfVar10[3] * 1.442695;
    auVar23._16_4_ = pfVar10[4] * 1.442695;
    auVar23._20_4_ = pfVar10[5] * 1.442695;
    auVar23._24_4_ = pfVar10[6] * 1.442695;
    auVar23._28_36_ = auVar24;
    auVar28._8_4_ = 0x43000000;
    auVar28._0_8_ = 0x4300000043000000;
    auVar28._12_4_ = 0x43000000;
    auVar28._16_4_ = 0x43000000;
    auVar28._20_4_ = 0x43000000;
    auVar28._24_4_ = 0x43000000;
    auVar28._28_4_ = 0x43000000;
    auVar42 = vminps_avx(auVar23._0_32_,auVar28);
    auVar37._8_4_ = 0xc2fe0000;
    auVar37._0_8_ = 0xc2fe0000c2fe0000;
    auVar37._12_4_ = 0xc2fe0000;
    auVar37._16_4_ = 0xc2fe0000;
    auVar37._20_4_ = 0xc2fe0000;
    auVar37._24_4_ = 0xc2fe0000;
    auVar37._28_4_ = 0xc2fe0000;
    auVar42 = vmaxps_avx(auVar42,auVar37);
    auVar27 = vroundps_avx(auVar42,1);
    auVar36 = vsubps_avx(auVar42,auVar27);
    auVar42 = vcvtps2dq_avx(auVar27);
    auVar46._8_4_ = 0xbe9d2ae5;
    auVar46._0_8_ = 0xbe9d2ae5be9d2ae5;
    auVar46._12_4_ = 0xbe9d2ae5;
    auVar46._16_4_ = 0xbe9d2ae5;
    auVar46._20_4_ = 0xbe9d2ae5;
    auVar46._24_4_ = 0xbe9d2ae5;
    auVar46._28_4_ = 0xbe9d2ae5;
    auVar47._8_4_ = 0xbd865310;
    auVar47._0_8_ = 0xbd865310bd865310;
    auVar47._12_4_ = 0xbd865310;
    auVar47._16_4_ = 0xbd865310;
    auVar47._20_4_ = 0xbd865310;
    auVar47._24_4_ = 0xbd865310;
    auVar47._28_4_ = 0xbd865310;
    auVar54._0_4_ = auVar36._0_4_ * auVar36._0_4_;
    auVar54._4_4_ = auVar36._4_4_ * auVar36._4_4_;
    auVar54._8_4_ = auVar36._8_4_ * auVar36._8_4_;
    auVar54._12_4_ = auVar36._12_4_ * auVar36._12_4_;
    auVar54._16_4_ = auVar36._16_4_ * auVar36._16_4_;
    auVar54._20_4_ = auVar36._20_4_ * auVar36._20_4_;
    auVar54._24_4_ = auVar36._24_4_ * auVar36._24_4_;
    auVar54._28_36_ = auVar55;
    auVar60._8_4_ = 0xbc5e18ed;
    auVar60._0_8_ = 0xbc5e18edbc5e18ed;
    auVar60._12_4_ = 0xbc5e18ed;
    auVar60._16_4_ = 0xbc5e18ed;
    auVar60._20_4_ = 0xbc5e18ed;
    auVar60._24_4_ = 0xbc5e18ed;
    auVar60._28_4_ = 0xbc5e18ed;
    auVar19 = vfmadd213ps_fma(auVar47,auVar36,auVar46);
    auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar54._0_32_,auVar60);
    auVar27 = vsubps_avx(auVar36,auVar54._0_32_);
    auVar19 = vfmadd213ps_fma(auVar27,ZEXT1632(auVar19),auVar36);
    auVar52._0_4_ = auVar19._0_4_ + 1.0;
    auVar52._4_4_ = auVar19._4_4_ + 1.0;
    auVar52._8_4_ = auVar19._8_4_ + 1.0;
    auVar52._12_4_ = auVar19._12_4_ + 1.0;
    auVar52._16_4_ = 0x3f800000;
    auVar52._20_4_ = 0x3f800000;
    auVar52._24_4_ = 0x3f800000;
    auVar52._28_4_ = 0x3f800000;
    auVar42 = vpslld_avx2(auVar42,0x17);
    auVar42 = vpaddd_avx2(auVar42,auVar52);
    auVar44 = ZEXT436(auVar42._28_4_);
    *pauVar9 = auVar42;
    auVar56._4_4_ = pfVar10[9] * 1.442695;
    auVar56._0_4_ = pfVar10[8] * 1.442695;
    auVar56._8_4_ = pfVar10[10] * 1.442695;
    auVar56._12_4_ = pfVar10[0xb] * 1.442695;
    auVar56._16_4_ = pfVar10[0xc] * 1.442695;
    auVar56._20_4_ = pfVar10[0xd] * 1.442695;
    auVar56._24_4_ = pfVar10[0xe] * 1.442695;
    auVar56._28_4_ = 0x3fb8aa3b;
    auVar42 = vminps_avx(auVar56,auVar28);
    auVar42 = vmaxps_avx(auVar42,auVar37);
    auVar27 = vroundps_avx(auVar42,1);
    auVar36 = vsubps_avx(auVar42,auVar27);
    auVar42 = vcvtps2dq_avx(auVar27);
    auVar5._4_4_ = auVar36._4_4_ * auVar36._4_4_;
    auVar5._0_4_ = auVar36._0_4_ * auVar36._0_4_;
    auVar5._8_4_ = auVar36._8_4_ * auVar36._8_4_;
    auVar5._12_4_ = auVar36._12_4_ * auVar36._12_4_;
    auVar5._16_4_ = auVar36._16_4_ * auVar36._16_4_;
    auVar5._20_4_ = auVar36._20_4_ * auVar36._20_4_;
    auVar5._24_4_ = auVar36._24_4_ * auVar36._24_4_;
    auVar5._28_4_ = 0xc2fe0000;
    auVar19 = vfmadd213ps_fma(auVar47,auVar36,auVar46);
    auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar5,auVar60);
    auVar27 = vsubps_avx(auVar36,auVar5);
    auVar19 = vfmadd213ps_fma(auVar27,ZEXT1632(auVar19),auVar36);
    auVar15._0_4_ = auVar19._0_4_ + 1.0;
    auVar15._4_4_ = auVar19._4_4_ + 1.0;
    auVar15._8_4_ = auVar19._8_4_ + 1.0;
    auVar15._12_4_ = auVar19._12_4_ + 1.0;
    auVar15._16_4_ = 0x3f800000;
    auVar15._20_4_ = 0x3f800000;
    auVar15._24_4_ = 0x3f800000;
    auVar15._28_4_ = 0x3f800000;
    auVar42 = vpslld_avx2(auVar42,0x17);
    auVar42 = vpaddd_avx2(auVar42,auVar15);
    pauVar9[1] = auVar42;
    pauVar9 = pauVar9 + 2;
    pfVar10 = pfVar10 + 0x10;
  }
  if ((size & 8) != 0) {
    auVar6._4_4_ = pfVar10[1] * 1.442695;
    auVar6._0_4_ = *pfVar10 * 1.442695;
    auVar6._8_4_ = pfVar10[2] * 1.442695;
    auVar6._12_4_ = pfVar10[3] * 1.442695;
    auVar6._16_4_ = pfVar10[4] * 1.442695;
    auVar6._20_4_ = pfVar10[5] * 1.442695;
    auVar6._24_4_ = pfVar10[6] * 1.442695;
    auVar6._28_4_ = 0x3fb8aa3b;
    auVar22._8_4_ = 0x43000000;
    auVar22._0_8_ = 0x4300000043000000;
    auVar22._12_4_ = 0x43000000;
    auVar22._16_4_ = 0x43000000;
    auVar22._20_4_ = 0x43000000;
    auVar22._24_4_ = 0x43000000;
    auVar22._28_4_ = 0x43000000;
    auVar29._8_4_ = 0xc2fe0000;
    auVar29._0_8_ = 0xc2fe0000c2fe0000;
    auVar29._12_4_ = 0xc2fe0000;
    auVar29._16_4_ = 0xc2fe0000;
    auVar29._20_4_ = 0xc2fe0000;
    auVar29._24_4_ = 0xc2fe0000;
    auVar29._28_4_ = 0xc2fe0000;
    auVar42 = vminps_avx(auVar6,auVar22);
    auVar42 = vmaxps_avx(auVar42,auVar29);
    auVar27 = vroundps_avx(auVar42,1);
    auVar36 = vsubps_avx(auVar42,auVar27);
    auVar30._8_4_ = 0xbe9d2ae5;
    auVar30._0_8_ = 0xbe9d2ae5be9d2ae5;
    auVar30._12_4_ = 0xbe9d2ae5;
    auVar30._16_4_ = 0xbe9d2ae5;
    auVar30._20_4_ = 0xbe9d2ae5;
    auVar30._24_4_ = 0xbe9d2ae5;
    auVar30._28_4_ = 0xbe9d2ae5;
    auVar38._8_4_ = 0xbd865310;
    auVar38._0_8_ = 0xbd865310bd865310;
    auVar38._12_4_ = 0xbd865310;
    auVar38._16_4_ = 0xbd865310;
    auVar38._20_4_ = 0xbd865310;
    auVar38._24_4_ = 0xbd865310;
    auVar38._28_4_ = 0xbd865310;
    auVar42 = vcvtps2dq_avx(auVar27);
    auVar19 = vfmadd213ps_fma(auVar38,auVar36,auVar30);
    auVar31._8_4_ = 0xbc5e18ed;
    auVar31._0_8_ = 0xbc5e18edbc5e18ed;
    auVar31._12_4_ = 0xbc5e18ed;
    auVar31._16_4_ = 0xbc5e18ed;
    auVar31._20_4_ = 0xbc5e18ed;
    auVar31._24_4_ = 0xbc5e18ed;
    auVar31._28_4_ = 0xbc5e18ed;
    auVar43._0_4_ = auVar36._0_4_ * auVar36._0_4_;
    auVar43._4_4_ = auVar36._4_4_ * auVar36._4_4_;
    auVar43._8_4_ = auVar36._8_4_ * auVar36._8_4_;
    auVar43._12_4_ = auVar36._12_4_ * auVar36._12_4_;
    auVar43._16_4_ = auVar36._16_4_ * auVar36._16_4_;
    auVar43._20_4_ = auVar36._20_4_ * auVar36._20_4_;
    auVar43._24_4_ = auVar36._24_4_ * auVar36._24_4_;
    auVar43._28_36_ = auVar44;
    auVar19 = vfmadd213ps_fma(auVar31,auVar43._0_32_,ZEXT1632(auVar19));
    auVar27 = vsubps_avx(auVar36,auVar43._0_32_);
    auVar19 = vfmadd213ps_fma(auVar27,ZEXT1632(auVar19),auVar36);
    auVar16._0_4_ = auVar19._0_4_ + 1.0;
    auVar16._4_4_ = auVar19._4_4_ + 1.0;
    auVar16._8_4_ = auVar19._8_4_ + 1.0;
    auVar16._12_4_ = auVar19._12_4_ + 1.0;
    auVar16._16_4_ = 0x3f800000;
    auVar16._20_4_ = 0x3f800000;
    auVar16._24_4_ = 0x3f800000;
    auVar16._28_4_ = 0x3f800000;
    auVar42 = vpslld_avx2(auVar42,0x17);
    auVar42 = vpaddd_avx2(auVar42,auVar16);
    *pauVar9 = auVar42;
    pauVar9 = pauVar9 + 1;
    pfVar10 = pfVar10 + 8;
  }
  if ((size & 4) != 0) {
    auVar19._0_4_ = *pfVar10 * 1.442695;
    auVar19._4_4_ = pfVar10[1] * 1.442695;
    auVar19._8_4_ = pfVar10[2] * 1.442695;
    auVar19._12_4_ = pfVar10[3] * 1.442695;
    auVar17._8_4_ = 0x43000000;
    auVar17._0_8_ = 0x4300000043000000;
    auVar17._12_4_ = 0x43000000;
    auVar19 = vminps_avx(auVar19,auVar17);
    auVar18._8_4_ = 0xc2fe0000;
    auVar18._0_8_ = 0xc2fe0000c2fe0000;
    auVar18._12_4_ = 0xc2fe0000;
    auVar19 = vmaxps_avx(auVar19,auVar18);
    auVar17 = vroundps_avx(auVar19,1);
    auVar11 = vsubps_avx(auVar19,auVar17);
    auVar19 = vcvtps2dq_avx(auVar17);
    auVar25._0_4_ = auVar11._0_4_ * auVar11._0_4_;
    auVar25._4_4_ = auVar11._4_4_ * auVar11._4_4_;
    auVar25._8_4_ = auVar11._8_4_ * auVar11._8_4_;
    auVar25._12_4_ = auVar11._12_4_ * auVar11._12_4_;
    auVar32._8_4_ = 0xbe9d2ae5;
    auVar32._0_8_ = 0xbe9d2ae5be9d2ae5;
    auVar32._12_4_ = 0xbe9d2ae5;
    auVar39._8_4_ = 0xbd865310;
    auVar39._0_8_ = 0xbd865310bd865310;
    auVar39._12_4_ = 0xbd865310;
    auVar17 = vfmadd213ps_fma(auVar39,auVar11,auVar32);
    auVar33._8_4_ = 0xbc5e18ed;
    auVar33._0_8_ = 0xbc5e18edbc5e18ed;
    auVar33._12_4_ = 0xbc5e18ed;
    auVar18 = vfmadd213ps_fma(auVar33,auVar25,auVar17);
    auVar17 = vsubps_avx(auVar11,auVar25);
    auVar17 = vfmadd213ps_fma(auVar17,auVar18,auVar11);
    auVar11._0_4_ = auVar17._0_4_ + 1.0;
    auVar11._4_4_ = auVar17._4_4_ + 1.0;
    auVar11._8_4_ = auVar17._8_4_ + 1.0;
    auVar11._12_4_ = auVar17._12_4_ + 1.0;
    auVar19 = vpslld_avx(auVar19,0x17);
    auVar19 = vpaddd_avx(auVar19,auVar11);
    *(undefined1 (*) [16])*pauVar9 = auVar19;
    pauVar9 = (undefined1 (*) [32])(*pauVar9 + 0x10);
    pfVar10 = pfVar10 + 4;
  }
  if ((size & 2) != 0) {
    auVar12._0_4_ = (float)*(undefined8 *)pfVar10 * 1.442695;
    auVar12._4_4_ = (float)((ulong)*(undefined8 *)pfVar10 >> 0x20) * 1.442695;
    auVar12._8_8_ = 0;
    auVar20._8_4_ = 0x43000000;
    auVar20._0_8_ = 0x4300000043000000;
    auVar20._12_4_ = 0x43000000;
    auVar19 = vminps_avx(auVar12,auVar20);
    auVar21._8_4_ = 0xc2fe0000;
    auVar21._0_8_ = 0xc2fe0000c2fe0000;
    auVar21._12_4_ = 0xc2fe0000;
    auVar19 = vmaxps_avx(auVar19,auVar21);
    auVar17 = vroundps_avx(auVar19,1);
    auVar11 = vsubps_avx(auVar19,auVar17);
    auVar19 = vcvtps2dq_avx(auVar17);
    auVar26._0_4_ = auVar11._0_4_ * auVar11._0_4_;
    auVar26._4_4_ = auVar11._4_4_ * auVar11._4_4_;
    auVar26._8_4_ = auVar11._8_4_ * auVar11._8_4_;
    auVar26._12_4_ = auVar11._12_4_ * auVar11._12_4_;
    auVar34._8_4_ = 0xbe9d2ae5;
    auVar34._0_8_ = 0xbe9d2ae5be9d2ae5;
    auVar34._12_4_ = 0xbe9d2ae5;
    auVar40._8_4_ = 0xbd865310;
    auVar40._0_8_ = 0xbd865310bd865310;
    auVar40._12_4_ = 0xbd865310;
    auVar17 = vfmadd213ps_fma(auVar40,auVar11,auVar34);
    auVar35._8_4_ = 0xbc5e18ed;
    auVar35._0_8_ = 0xbc5e18edbc5e18ed;
    auVar35._12_4_ = 0xbc5e18ed;
    auVar18 = vfmadd213ps_fma(auVar35,auVar26,auVar17);
    auVar17 = vsubps_avx(auVar11,auVar26);
    auVar17 = vfmadd213ps_fma(auVar17,auVar18,auVar11);
    auVar13._0_4_ = auVar17._0_4_ + 1.0;
    auVar13._4_4_ = auVar17._4_4_ + 1.0;
    auVar13._8_4_ = auVar17._8_4_ + 1.0;
    auVar13._12_4_ = auVar17._12_4_ + 1.0;
    auVar19 = vpslld_avx(auVar19,0x17);
    auVar19 = vpaddd_avx(auVar19,auVar13);
    *(long *)*pauVar9 = auVar19._0_8_;
    pauVar9 = (undefined1 (*) [32])(*pauVar9 + 8);
    pfVar10 = pfVar10 + 2;
  }
  if ((size & 1) != 0) {
    auVar14._4_12_ = SUB6412(ZEXT1664((undefined1  [16])0x0),4);
    auVar14._0_4_ = *pfVar10 * 1.442695;
    auVar19 = vminss_avx(auVar14,ZEXT416(0x43000000));
    auVar19 = vmaxss_avx(auVar19,ZEXT416(0xc2fe0000));
    auVar17 = vroundss_avx(auVar19,auVar19,1);
    fVar3 = auVar19._0_4_ - auVar17._0_4_;
    auVar19 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbd865310),0),ZEXT416((uint)fVar3),
                              ZEXT416(0xbe9d2ae5));
    auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)(fVar3 * fVar3)),ZEXT416(0xbc5e18ed));
    auVar11 = vfmadd213ss_fma(ZEXT416((uint)(fVar3 - fVar3 * fVar3)),auVar19,ZEXT416((uint)fVar3));
    auVar19 = vcvtps2dq_avx(auVar17);
    auVar19 = vpslld_avx(auVar19,0x17);
    auVar19 = vpaddd_avx(auVar19,ZEXT416((uint)(auVar11._0_4_ + 1.0)));
    *(int *)*pauVar9 = auVar19._0_4_;
  }
  return;
}

Assistant:

FORCE_INLINE void AVXExp(const P_Type1& from, size_t size, P_Type2&& to) noexcept {
        AVX_FLOAT_EXP_LIKE_FUNC_CALL((AVXCopy<false, I_OutAligned>), S_Pow, size * c_elem_size, c::c_1_over_ln_2);
    }